

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationruleparser.cpp
# Opt level: O0

int32_t __thiscall icu_63::CollationRuleParser::skipComment(CollationRuleParser *this,int32_t i)

{
  char16_t cVar1;
  int32_t iVar2;
  int iVar3;
  int local_14;
  UChar c;
  int32_t i_local;
  CollationRuleParser *this_local;
  
  local_14 = i;
  while( true ) {
    iVar2 = UnicodeString::length(this->rules);
    if (iVar2 <= local_14) {
      return local_14;
    }
    iVar3 = local_14 + 1;
    cVar1 = UnicodeString::charAt(this->rules,local_14);
    if (cVar1 == L'\n') {
      return iVar3;
    }
    if (cVar1 == L'\f') {
      return iVar3;
    }
    if (cVar1 == L'\r') break;
    if (cVar1 == L'\x85') {
      return iVar3;
    }
    if (cVar1 == L'\x2028') {
      return iVar3;
    }
    local_14 = iVar3;
    if (cVar1 == L'\x2029') {
      return iVar3;
    }
  }
  return iVar3;
}

Assistant:

int32_t
CollationRuleParser::skipComment(int32_t i) const {
    // skip to past the newline
    while(i < rules->length()) {
        UChar c = rules->charAt(i++);
        // LF or FF or CR or NEL or LS or PS
        if(c == 0xa || c == 0xc || c == 0xd || c == 0x85 || c == 0x2028 || c == 0x2029) {
            // Unicode Newline Guidelines: "A readline function should stop at NLF, LS, FF, or PS."
            // NLF (new line function) = CR or LF or CR+LF or NEL.
            // No need to collect all of CR+LF because a following LF will be ignored anyway.
            break;
        }
    }
    return i;
}